

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O1

void Str_MuxStructCollect(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vNodes)

{
  if (((uint)*(ulong *)pObj >> 0x1e & 1) == 0) {
    *(ulong *)pObj = *(ulong *)pObj | 0x40000000;
    vNodes->nSize = 0;
    Str_MuxStructCollect_rec(p,pObj,vNodes);
    pObj->field_0x3 = pObj->field_0x3 & 0xbf;
    return;
  }
  __assert_fail("!pObj->fMark0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaStr.c"
                ,0x147,"void Str_MuxStructCollect(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
}

Assistant:

void Str_MuxStructCollect( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vNodes )
{
    assert( !pObj->fMark0 );
    pObj->fMark0 = 1;
    Vec_IntClear( vNodes );
    Str_MuxStructCollect_rec( p, pObj, vNodes );
    pObj->fMark0 = 0;
}